

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O0

bool __thiscall cmQtAutoGenInitializer::SetupWriteAutogenInfo(cmQtAutoGenInitializer *this)

{
  cmGeneratorTarget *pcVar1;
  bool bVar2;
  char *pcVar3;
  unordered_map<cmSourceFile_*,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::hash<cmSourceFile_*>,_std::equal_to<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>_>
  *puVar4;
  reference ppVar5;
  type __x;
  iterator __first;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar6;
  allocator<char> local_6e1;
  undefined1 local_6e0 [8];
  string err;
  allocator<char> local_6aa;
  allocator<char> local_6a9;
  string local_6a8;
  string local_688;
  allocator<char> local_662;
  allocator<char> local_661;
  string local_660;
  string local_640;
  string local_620;
  allocator<char> local_5fa;
  allocator<char> local_5f9;
  string local_5f8;
  string local_5d8;
  _Base_ptr local_5b8;
  undefined1 local_5b0;
  _Base_ptr local_5a8;
  undefined1 local_5a0;
  _Base_ptr local_598;
  undefined1 local_590;
  _Base_ptr local_588;
  undefined1 local_580;
  _Base_ptr local_578;
  undefined1 local_570;
  type local_568;
  MUFile *muf_1;
  pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>
  *pair_1;
  iterator __end2_1;
  iterator __begin2_1;
  unordered_map<cmSourceFile_*,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::hash<cmSourceFile_*>,_std::equal_to<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>_>
  *__range2_1;
  MUFile *muf;
  pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>
  *pair;
  iterator __end2;
  iterator __begin2;
  unordered_map<cmSourceFile_*,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::hash<cmSourceFile_*>,_std::equal_to<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>_>
  *__range2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uic_skip;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uic_sources;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uic_headers;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  moc_skip;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  moc_sources;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  moc_headers;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sources;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headers;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  allocator<char> local_2a1;
  string local_2a0;
  cmMakefile *local_280;
  anon_class_8_1_ea5e79e8 MfDef;
  cmMakefile *makefile;
  undefined1 local_260 [8];
  InfoWriter ofs;
  cmQtAutoGenInitializer *this_local;
  
  ofs.Ofs_._576_8_ = this;
  InfoWriter::InfoWriter((InfoWriter *)local_260,&(this->AutogenTarget).InfoFile);
  bVar2 = InfoWriter::operator_cast_to_bool((InfoWriter *)local_260);
  if (bVar2) {
    local_280 = cmTarget::GetMakefile(this->Target->Target);
    MfDef.makefile = local_280;
    InfoWriter::Write((InfoWriter *)local_260,"# Meta\n");
    pcVar3 = "FALSE";
    if ((this->MultiConfig & 1U) != 0) {
      pcVar3 = "TRUE";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,pcVar3,&local_2a1);
    InfoWriter::Write((InfoWriter *)local_260,"AM_MULTI_CONFIG",&local_2a0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::allocator<char>::~allocator(&local_2a1);
    InfoWriter::Write((InfoWriter *)local_260,"AM_PARALLEL",&(this->AutogenTarget).Parallel);
    InfoWriter::Write((InfoWriter *)local_260,"AM_VERBOSITY",&this->Verbosity);
    InfoWriter::Write((InfoWriter *)local_260,"# Directories\n");
    SetupWriteAutogenInfo()::$_0::operator()[abi_cxx11_(&local_2c8,&local_280,"CMAKE_SOURCE_DIR");
    InfoWriter::Write((InfoWriter *)local_260,"AM_CMAKE_SOURCE_DIR",&local_2c8);
    std::__cxx11::string::~string((string *)&local_2c8);
    SetupWriteAutogenInfo()::$_0::operator()[abi_cxx11_(&local_2e8,&local_280,"CMAKE_BINARY_DIR");
    InfoWriter::Write((InfoWriter *)local_260,"AM_CMAKE_BINARY_DIR",&local_2e8);
    std::__cxx11::string::~string((string *)&local_2e8);
    SetupWriteAutogenInfo()::$_0::operator()[abi_cxx11_
              (&local_308,&local_280,"CMAKE_CURRENT_SOURCE_DIR");
    InfoWriter::Write((InfoWriter *)local_260,"AM_CMAKE_CURRENT_SOURCE_DIR",&local_308);
    std::__cxx11::string::~string((string *)&local_308);
    SetupWriteAutogenInfo()::$_0::operator()[abi_cxx11_
              (&local_328,&local_280,"CMAKE_CURRENT_BINARY_DIR");
    InfoWriter::Write((InfoWriter *)local_260,"AM_CMAKE_CURRENT_BINARY_DIR",&local_328);
    std::__cxx11::string::~string((string *)&local_328);
    SetupWriteAutogenInfo()::$_0::operator()[abi_cxx11_
              ((string *)&headers._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_280,
               "CMAKE_INCLUDE_DIRECTORIES_PROJECT_BEFORE");
    InfoWriter::Write((InfoWriter *)local_260,"AM_CMAKE_INCLUDE_DIRECTORIES_PROJECT_BEFORE",
                      (string *)&headers._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::string::~string
              ((string *)&headers._M_t._M_impl.super__Rb_tree_header._M_node_count);
    InfoWriter::Write((InfoWriter *)local_260,"AM_BUILD_DIR",&(this->Dir).Build);
    InfoWriter::Write((InfoWriter *)local_260,"AM_INCLUDE_DIR",&(this->Dir).Include);
    InfoWriter::WriteConfig((InfoWriter *)local_260,"AM_INCLUDE_DIR",&(this->Dir).ConfigInclude);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&sources._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&moc_headers._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&moc_sources._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&moc_skip._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&uic_headers._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&uic_sources._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&uic_skip._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&__range2);
    puVar4 = &(this->AutogenTarget).Headers;
    __end2 = std::
             unordered_map<cmSourceFile_*,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::hash<cmSourceFile_*>,_std::equal_to<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>_>
             ::begin(puVar4);
    pair = (pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>
            *)std::
              unordered_map<cmSourceFile_*,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::hash<cmSourceFile_*>,_std::equal_to<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>_>
              ::end(puVar4);
    while (bVar2 = std::__detail::operator!=
                             (&__end2.
                               super__Node_iterator_base<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_false>
                              ,(_Node_iterator_base<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_false>
                                *)&pair), bVar2) {
      ppVar5 = std::__detail::
               _Node_iterator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_false,_false>
               ::operator*(&__end2);
      __x = std::
            unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
            ::operator*(&ppVar5->second);
      if (((__x->Generated & 1U) == 0) || ((this->CMP0071Accept & 1U) != 0)) {
        if ((__x->SkipMoc & 1U) != 0) {
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&uic_headers._M_t._M_impl.super__Rb_tree_header._M_node_count,&__x->RealPath);
        }
        if ((__x->SkipUic & 1U) != 0) {
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range2,&__x->RealPath);
        }
        if (((__x->MocIt & 1U) == 0) || ((__x->UicIt & 1U) == 0)) {
          if ((__x->MocIt & 1U) == 0) {
            if ((__x->UicIt & 1U) != 0) {
              std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&uic_sources._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       &__x->RealPath);
            }
          }
          else {
            std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&moc_sources._M_t._M_impl.super__Rb_tree_header._M_node_count,&__x->RealPath
                    );
          }
        }
        else {
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&sources._M_t._M_impl.super__Rb_tree_header._M_node_count,&__x->RealPath);
        }
      }
      std::__detail::
      _Node_iterator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_false,_false>
      ::operator++(&__end2);
    }
    puVar4 = &(this->AutogenTarget).Sources;
    __end2_1 = std::
               unordered_map<cmSourceFile_*,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::hash<cmSourceFile_*>,_std::equal_to<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>_>
               ::begin(puVar4);
    pair_1 = (pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>
              *)std::
                unordered_map<cmSourceFile_*,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::hash<cmSourceFile_*>,_std::equal_to<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>_>
                ::end(puVar4);
    while (bVar2 = std::__detail::operator!=
                             (&__end2_1.
                               super__Node_iterator_base<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_false>
                              ,(_Node_iterator_base<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_false>
                                *)&pair_1), bVar2) {
      muf_1 = (MUFile *)
              std::__detail::
              _Node_iterator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_false,_false>
              ::operator*(&__end2_1);
      local_568 = std::
                  unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                  ::operator*((unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                               *)&(muf_1->RealPath)._M_string_length);
      if (((local_568->Generated & 1U) == 0) || ((this->CMP0071Accept & 1U) != 0)) {
        if ((local_568->SkipMoc & 1U) != 0) {
          pVar6 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&uic_headers._M_t._M_impl.super__Rb_tree_header._M_node_count,
                           &local_568->RealPath);
          local_578 = (_Base_ptr)pVar6.first._M_node;
          local_570 = pVar6.second;
        }
        if ((local_568->SkipUic & 1U) != 0) {
          pVar6 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&__range2,&local_568->RealPath);
          local_588 = (_Base_ptr)pVar6.first._M_node;
          local_580 = pVar6.second;
        }
        if (((local_568->MocIt & 1U) == 0) || ((local_568->UicIt & 1U) == 0)) {
          if ((local_568->MocIt & 1U) == 0) {
            if ((local_568->UicIt & 1U) != 0) {
              pVar6 = std::
                      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&uic_skip._M_t._M_impl.super__Rb_tree_header._M_node_count,
                               &local_568->RealPath);
              local_5b8 = (_Base_ptr)pVar6.first._M_node;
              local_5b0 = pVar6.second;
            }
          }
          else {
            pVar6 = std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&moc_skip._M_t._M_impl.super__Rb_tree_header._M_node_count,
                             &local_568->RealPath);
            local_5a8 = (_Base_ptr)pVar6.first._M_node;
            local_5a0 = pVar6.second;
          }
        }
        else {
          pVar6 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&moc_headers._M_t._M_impl.super__Rb_tree_header._M_node_count,
                           &local_568->RealPath);
          local_598 = (_Base_ptr)pVar6.first._M_node;
          local_590 = pVar6.second;
        }
      }
      std::__detail::
      _Node_iterator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_false,_false>
      ::operator++(&__end2_1);
    }
    InfoWriter::Write((InfoWriter *)local_260,"# Qt\n");
    InfoWriter::WriteUInt((InfoWriter *)local_260,"AM_QT_VERSION_MAJOR",(this->QtVersion).Major);
    InfoWriter::Write((InfoWriter *)local_260,"AM_QT_MOC_EXECUTABLE",
                      &(this->Moc).super_GenVarsT.Executable);
    InfoWriter::Write((InfoWriter *)local_260,"AM_QT_UIC_EXECUTABLE",
                      &(this->Uic).super_GenVarsT.Executable);
    InfoWriter::Write((InfoWriter *)local_260,"# Files\n");
    InfoWriter::Write((InfoWriter *)local_260,"AM_SETTINGS_FILE",&(this->AutogenTarget).SettingsFile
                     );
    InfoWriter::WriteConfig
              ((InfoWriter *)local_260,"AM_SETTINGS_FILE",&(this->AutogenTarget).ConfigSettingsFile)
    ;
    InfoWriter::
    WriteStrings<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
              ((InfoWriter *)local_260,"AM_HEADERS",
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&sources._M_t._M_impl.super__Rb_tree_header._M_node_count);
    InfoWriter::
    WriteStrings<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
              ((InfoWriter *)local_260,"AM_SOURCES",
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&moc_headers._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (((this->Moc).super_GenVarsT.Enabled & 1U) != 0) {
      InfoWriter::Write((InfoWriter *)local_260,"# MOC settings\n");
      InfoWriter::
      WriteStrings<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                ((InfoWriter *)local_260,"AM_MOC_HEADERS",
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&moc_sources._M_t._M_impl.super__Rb_tree_header._M_node_count);
      InfoWriter::
      WriteStrings<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                ((InfoWriter *)local_260,"AM_MOC_SOURCES",
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&moc_skip._M_t._M_impl.super__Rb_tree_header._M_node_count);
      InfoWriter::
      WriteStrings<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                ((InfoWriter *)local_260,"AM_MOC_SKIP",
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&uic_headers._M_t._M_impl.super__Rb_tree_header._M_node_count);
      InfoWriter::
      WriteStrings<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                ((InfoWriter *)local_260,"AM_MOC_DEFINITIONS",&(this->Moc).Defines);
      InfoWriter::
      WriteConfigStrings<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                ((InfoWriter *)local_260,"AM_MOC_DEFINITIONS",&(this->Moc).ConfigDefines);
      InfoWriter::
      WriteStrings<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((InfoWriter *)local_260,"AM_MOC_INCLUDES",&(this->Moc).Includes);
      InfoWriter::
      WriteConfigStrings<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((InfoWriter *)local_260,"AM_MOC_INCLUDES",&(this->Moc).ConfigIncludes);
      pcVar1 = this->Target;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5f8,"AUTOMOC_MOC_OPTIONS",&local_5f9);
      pcVar3 = cmGeneratorTarget::GetSafeProperty(pcVar1,&local_5f8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_5d8,pcVar3,&local_5fa);
      InfoWriter::Write((InfoWriter *)local_260,"AM_MOC_OPTIONS",&local_5d8);
      std::__cxx11::string::~string((string *)&local_5d8);
      std::allocator<char>::~allocator(&local_5fa);
      std::__cxx11::string::~string((string *)&local_5f8);
      std::allocator<char>::~allocator(&local_5f9);
      SetupWriteAutogenInfo()::$_0::operator()[abi_cxx11_
                (&local_620,&local_280,"CMAKE_AUTOMOC_RELAXED_MODE");
      InfoWriter::Write((InfoWriter *)local_260,"AM_MOC_RELAXED_MODE",&local_620);
      std::__cxx11::string::~string((string *)&local_620);
      pcVar1 = this->Target;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_660,"AUTOMOC_MACRO_NAMES",&local_661);
      pcVar3 = cmGeneratorTarget::GetSafeProperty(pcVar1,&local_660);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_640,pcVar3,&local_662);
      InfoWriter::Write((InfoWriter *)local_260,"AM_MOC_MACRO_NAMES",&local_640);
      std::__cxx11::string::~string((string *)&local_640);
      std::allocator<char>::~allocator(&local_662);
      std::__cxx11::string::~string((string *)&local_660);
      std::allocator<char>::~allocator(&local_661);
      pcVar1 = this->Target;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6a8,"AUTOMOC_DEPEND_FILTERS",&local_6a9);
      pcVar3 = cmGeneratorTarget::GetSafeProperty(pcVar1,&local_6a8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_688,pcVar3,&local_6aa);
      InfoWriter::Write((InfoWriter *)local_260,"AM_MOC_DEPEND_FILTERS",&local_688);
      std::__cxx11::string::~string((string *)&local_688);
      std::allocator<char>::~allocator(&local_6aa);
      std::__cxx11::string::~string((string *)&local_6a8);
      std::allocator<char>::~allocator(&local_6a9);
      InfoWriter::Write((InfoWriter *)local_260,"AM_MOC_PREDEFS_CMD",&(this->Moc).PredefsCmd);
    }
    if (((this->Uic).super_GenVarsT.Enabled & 1U) != 0) {
      this_00 = &(this->Uic).SkipUi;
      __first = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin(this_00);
      err.field_2._8_8_ =
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(this_00);
      std::
      set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::insert<std::_Rb_tree_const_iterator<std::__cxx11::string>>
                ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&__range2,
                 (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )__first._M_node,
                 (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )err.field_2._8_8_);
      InfoWriter::Write((InfoWriter *)local_260,"# UIC settings\n");
      InfoWriter::
      WriteStrings<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                ((InfoWriter *)local_260,"AM_UIC_HEADERS",
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&uic_sources._M_t._M_impl.super__Rb_tree_header._M_node_count);
      InfoWriter::
      WriteStrings<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                ((InfoWriter *)local_260,"AM_UIC_SOURCES",
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&uic_skip._M_t._M_impl.super__Rb_tree_header._M_node_count);
      InfoWriter::
      WriteStrings<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                ((InfoWriter *)local_260,"AM_UIC_SKIP",
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range2);
      InfoWriter::
      WriteStrings<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((InfoWriter *)local_260,"AM_UIC_TARGET_OPTIONS",&(this->Uic).Options);
      InfoWriter::
      WriteConfigStrings<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((InfoWriter *)local_260,"AM_UIC_TARGET_OPTIONS",&(this->Uic).ConfigOptions);
      InfoWriter::
      WriteStrings<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((InfoWriter *)local_260,"AM_UIC_OPTIONS_FILES",&(this->Uic).FileFiles);
      InfoWriter::WriteNestedLists
                ((InfoWriter *)local_260,"AM_UIC_OPTIONS_OPTIONS",&(this->Uic).FileOptions);
      InfoWriter::
      WriteStrings<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((InfoWriter *)local_260,"AM_UIC_SEARCH_PATHS",&(this->Uic).SearchPaths);
    }
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range2);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&uic_skip._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&uic_sources._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&uic_headers._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&moc_skip._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&moc_sources._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&moc_headers._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&sources._M_t._M_impl.super__Rb_tree_header._M_node_count);
    this_local._7_1_ = true;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_6e0,"AutoGen: Could not write file ",&local_6e1);
    std::allocator<char>::~allocator(&local_6e1);
    std::__cxx11::string::operator+=((string *)local_6e0,(string *)&(this->AutogenTarget).InfoFile);
    cmSystemTools::Error((string *)local_6e0);
    this_local._7_1_ = false;
    std::__cxx11::string::~string((string *)local_6e0);
  }
  InfoWriter::~InfoWriter((InfoWriter *)local_260);
  return this_local._7_1_;
}

Assistant:

bool cmQtAutoGenInitializer::SetupWriteAutogenInfo()
{
  InfoWriter ofs(this->AutogenTarget.InfoFile);
  if (ofs) {
    // Utility lambdas
    cmMakefile* makefile = this->Target->Target->GetMakefile();
    auto MfDef = [makefile](const char* key) {
      return makefile->GetSafeDefinition(key);
    };

    // Write common settings
    ofs.Write("# Meta\n");
    ofs.Write("AM_MULTI_CONFIG", this->MultiConfig ? "TRUE" : "FALSE");
    ofs.Write("AM_PARALLEL", this->AutogenTarget.Parallel);
    ofs.Write("AM_VERBOSITY", this->Verbosity);

    ofs.Write("# Directories\n");
    ofs.Write("AM_CMAKE_SOURCE_DIR", MfDef("CMAKE_SOURCE_DIR"));
    ofs.Write("AM_CMAKE_BINARY_DIR", MfDef("CMAKE_BINARY_DIR"));
    ofs.Write("AM_CMAKE_CURRENT_SOURCE_DIR",
              MfDef("CMAKE_CURRENT_SOURCE_DIR"));
    ofs.Write("AM_CMAKE_CURRENT_BINARY_DIR",
              MfDef("CMAKE_CURRENT_BINARY_DIR"));
    ofs.Write("AM_CMAKE_INCLUDE_DIRECTORIES_PROJECT_BEFORE",
              MfDef("CMAKE_INCLUDE_DIRECTORIES_PROJECT_BEFORE"));
    ofs.Write("AM_BUILD_DIR", this->Dir.Build);
    ofs.Write("AM_INCLUDE_DIR", this->Dir.Include);
    ofs.WriteConfig("AM_INCLUDE_DIR", this->Dir.ConfigInclude);

    // Use sorted sets
    std::set<std::string> headers;
    std::set<std::string> sources;
    std::set<std::string> moc_headers;
    std::set<std::string> moc_sources;
    std::set<std::string> moc_skip;
    std::set<std::string> uic_headers;
    std::set<std::string> uic_sources;
    std::set<std::string> uic_skip;
    // Filter headers
    for (auto const& pair : this->AutogenTarget.Headers) {
      MUFile const& muf = *pair.second;
      if (muf.Generated && !this->CMP0071Accept) {
        continue;
      }
      if (muf.SkipMoc) {
        moc_skip.insert(muf.RealPath);
      }
      if (muf.SkipUic) {
        uic_skip.insert(muf.RealPath);
      }
      if (muf.MocIt && muf.UicIt) {
        headers.insert(muf.RealPath);
      } else if (muf.MocIt) {
        moc_headers.insert(muf.RealPath);
      } else if (muf.UicIt) {
        uic_headers.insert(muf.RealPath);
      }
    }
    // Filter sources
    for (auto const& pair : this->AutogenTarget.Sources) {
      MUFile const& muf = *pair.second;
      if (muf.Generated && !this->CMP0071Accept) {
        continue;
      }
      if (muf.SkipMoc) {
        moc_skip.insert(muf.RealPath);
      }
      if (muf.SkipUic) {
        uic_skip.insert(muf.RealPath);
      }
      if (muf.MocIt && muf.UicIt) {
        sources.insert(muf.RealPath);
      } else if (muf.MocIt) {
        moc_sources.insert(muf.RealPath);
      } else if (muf.UicIt) {
        uic_sources.insert(muf.RealPath);
      }
    }

    ofs.Write("# Qt\n");
    ofs.WriteUInt("AM_QT_VERSION_MAJOR", this->QtVersion.Major);
    ofs.Write("AM_QT_MOC_EXECUTABLE", this->Moc.Executable);
    ofs.Write("AM_QT_UIC_EXECUTABLE", this->Uic.Executable);

    ofs.Write("# Files\n");
    ofs.Write("AM_SETTINGS_FILE", this->AutogenTarget.SettingsFile);
    ofs.WriteConfig("AM_SETTINGS_FILE",
                    this->AutogenTarget.ConfigSettingsFile);
    ofs.WriteStrings("AM_HEADERS", headers);
    ofs.WriteStrings("AM_SOURCES", sources);

    // Write moc settings
    if (this->Moc.Enabled) {
      ofs.Write("# MOC settings\n");
      ofs.WriteStrings("AM_MOC_HEADERS", moc_headers);
      ofs.WriteStrings("AM_MOC_SOURCES", moc_sources);
      ofs.WriteStrings("AM_MOC_SKIP", moc_skip);
      ofs.WriteStrings("AM_MOC_DEFINITIONS", this->Moc.Defines);
      ofs.WriteConfigStrings("AM_MOC_DEFINITIONS", this->Moc.ConfigDefines);
      ofs.WriteStrings("AM_MOC_INCLUDES", this->Moc.Includes);
      ofs.WriteConfigStrings("AM_MOC_INCLUDES", this->Moc.ConfigIncludes);
      ofs.Write("AM_MOC_OPTIONS",
                this->Target->GetSafeProperty("AUTOMOC_MOC_OPTIONS"));
      ofs.Write("AM_MOC_RELAXED_MODE", MfDef("CMAKE_AUTOMOC_RELAXED_MODE"));
      ofs.Write("AM_MOC_MACRO_NAMES",
                this->Target->GetSafeProperty("AUTOMOC_MACRO_NAMES"));
      ofs.Write("AM_MOC_DEPEND_FILTERS",
                this->Target->GetSafeProperty("AUTOMOC_DEPEND_FILTERS"));
      ofs.Write("AM_MOC_PREDEFS_CMD", this->Moc.PredefsCmd);
    }

    // Write uic settings
    if (this->Uic.Enabled) {
      // Add skipped .ui files
      uic_skip.insert(this->Uic.SkipUi.begin(), this->Uic.SkipUi.end());

      ofs.Write("# UIC settings\n");
      ofs.WriteStrings("AM_UIC_HEADERS", uic_headers);
      ofs.WriteStrings("AM_UIC_SOURCES", uic_sources);
      ofs.WriteStrings("AM_UIC_SKIP", uic_skip);
      ofs.WriteStrings("AM_UIC_TARGET_OPTIONS", this->Uic.Options);
      ofs.WriteConfigStrings("AM_UIC_TARGET_OPTIONS", this->Uic.ConfigOptions);
      ofs.WriteStrings("AM_UIC_OPTIONS_FILES", this->Uic.FileFiles);
      ofs.WriteNestedLists("AM_UIC_OPTIONS_OPTIONS", this->Uic.FileOptions);
      ofs.WriteStrings("AM_UIC_SEARCH_PATHS", this->Uic.SearchPaths);
    }
  } else {
    std::string err = "AutoGen: Could not write file ";
    err += this->AutogenTarget.InfoFile;
    cmSystemTools::Error(err);
    return false;
  }

  return true;
}